

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

natwm_error monitor_setup(natwm_state *state,monitor_list **result)

{
  ushort uVar1;
  ushort uVar2;
  server_extension_type sVar3;
  xcb_randr_crtc_t xVar4;
  randr_monitor *monitor;
  xcb_rectangle_t xVar5;
  size_t sVar6;
  void *pvVar7;
  bool bVar8;
  natwm_error nVar9;
  server_extension *__ptr;
  list *list;
  xcb_randr_crtc_t *data;
  undefined4 *puVar10;
  monitor_list *list_00;
  char *pcVar11;
  node *pnVar12;
  undefined8 in_R8;
  undefined8 in_R9;
  randr_monitor **pprVar13;
  long lVar14;
  undefined8 uVar15;
  config_array *local_48;
  randr_monitor **monitors;
  list *local_38;
  
  uVar15 = 0x108621;
  __ptr = server_extension_detect(state->xcb);
  if (__ptr == (server_extension *)0x0) {
    return MEMORY_ALLOCATION_ERROR;
  }
  sVar3 = __ptr->type;
  list = list_create();
  local_38 = list;
  if (sVar3 == XINERAMA) {
    if (list == (list *)0x0) {
      nVar9 = MEMORY_ALLOCATION_ERROR;
    }
    else {
      local_48 = (config_array *)0x0;
      monitors = (randr_monitor **)0x0;
      nVar9 = xinerama_get_screens(state,(xcb_rectangle_t **)&local_48,(size_t *)&monitors);
      if (nVar9 == NO_ERROR) {
        if (monitors != (randr_monitor **)0x0) {
          pprVar13 = (randr_monitor **)0x0;
          do {
            sVar6 = (&local_48->length)[(long)pprVar13];
            puVar10 = (undefined4 *)malloc(0x20);
            if (puVar10 == (undefined4 *)0x0) {
              puVar10 = (undefined4 *)0x0;
            }
            else {
              *puVar10 = (int)pprVar13;
              *(size_t *)(puVar10 + 1) = sVar6;
              *(undefined8 *)(puVar10 + 6) = 0;
            }
            if (puVar10 == (undefined4 *)0x0) {
              for (pnVar12 = local_38->head; pnVar12 != (node *)0x0; pnVar12 = pnVar12->next) {
                free(pnVar12->data);
              }
              list_destroy(local_38);
              free(local_48);
            }
            else {
              list_insert(local_38,puVar10);
            }
            if (puVar10 == (undefined4 *)0x0) {
              nVar9 = MEMORY_ALLOCATION_ERROR;
              goto LAB_00108889;
            }
            pprVar13 = (randr_monitor **)((long)pprVar13 + 1);
          } while (pprVar13 < monitors);
        }
        free(local_48);
        nVar9 = NO_ERROR;
        list = local_38;
        goto LAB_0010888c;
      }
LAB_00108884:
      list_destroy(list);
    }
  }
  else if (sVar3 == RANDR) {
    nVar9 = MEMORY_ALLOCATION_ERROR;
    if (list != (list *)0x0) {
      local_48 = (config_array *)0x0;
      monitors = (randr_monitor **)0x0;
      nVar9 = randr_get_screens(state,(randr_monitor ***)&local_48,(size_t *)&monitors);
      if (nVar9 == NO_ERROR) {
        if (monitors != (randr_monitor **)0x0) {
          pprVar13 = (randr_monitor **)0x0;
          do {
            monitor = (randr_monitor *)(&local_48->length)[(long)pprVar13];
            if (monitor == (randr_monitor *)0x0) {
              bVar8 = false;
            }
            else {
              xVar4 = monitor->id;
              xVar5 = monitor->rect;
              data = (xcb_randr_crtc_t *)malloc(0x20);
              list = local_38;
              if (data == (xcb_randr_crtc_t *)0x0) {
                data = (xcb_randr_crtc_t *)0x0;
              }
              else {
                *data = xVar4;
                *(xcb_rectangle_t *)(data + 1) = xVar5;
                data[6] = 0;
                data[7] = 0;
              }
              if (data == (xcb_randr_crtc_t *)0x0) {
                for (pnVar12 = local_38->head; pnVar12 != (node *)0x0; pnVar12 = pnVar12->next) {
                  free(pnVar12->data);
                }
                list_destroy(list);
                bVar8 = true;
              }
              else {
                list_insert(local_38,data);
                randr_monitor_destroy(monitor);
                bVar8 = false;
              }
            }
            if (bVar8) goto LAB_00108af0;
            pprVar13 = (randr_monitor **)((long)pprVar13 + 1);
          } while (pprVar13 < monitors);
        }
        free(local_48);
        nVar9 = NO_ERROR;
        goto LAB_0010888c;
      }
      goto LAB_00108884;
    }
  }
  else {
    nVar9 = MEMORY_ALLOCATION_ERROR;
    if (list != (list *)0x0) {
      uVar1 = state->screen->width_in_pixels;
      uVar2 = state->screen->height_in_pixels;
      puVar10 = (undefined4 *)malloc(0x20);
      list = local_38;
      if (puVar10 == (undefined4 *)0x0) {
        puVar10 = (undefined4 *)0x0;
      }
      else {
        *puVar10 = 0;
        *(ulong *)(puVar10 + 1) = (ulong)uVar1 << 0x20 | (ulong)uVar2 << 0x30;
        *(undefined8 *)(puVar10 + 6) = 0;
      }
      if (puVar10 == (undefined4 *)0x0) {
        list_destroy(local_38);
LAB_00108af0:
        nVar9 = MEMORY_ALLOCATION_ERROR;
        list = (list *)0x0;
      }
      else {
        list_insert(local_38,puVar10);
        nVar9 = NO_ERROR;
      }
      goto LAB_0010888c;
    }
  }
LAB_00108889:
  list = (list *)0x0;
LAB_0010888c:
  if (nVar9 == NO_ERROR) {
    if (list->size == 0) {
      if ((ulong)__ptr->type < 3) {
        pcVar11 = (&PTR_anon_var_dwarf_e252_00111cb0)[__ptr->type];
      }
      else {
        pcVar11 = "";
      }
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find a %s screen",pcVar11,in_R8,in_R9,
                      uVar15);
      free(__ptr);
      nVar9 = INVALID_INPUT_ERROR;
    }
    else {
      list_00 = (monitor_list *)malloc(0x10);
      if (list_00 == (monitor_list *)0x0) {
        list_00 = (monitor_list *)0x0;
      }
      else {
        list_00->extension = __ptr;
        list_00->monitors = list;
      }
      if (list_00 == (monitor_list *)0x0) {
        free(__ptr);
        list_destroy(list);
        nVar9 = MEMORY_ALLOCATION_ERROR;
      }
      else {
        local_48 = (config_array *)0x0;
        config_find_array(state->config,"monitor.offsets",&local_48);
        if ((local_48 != (config_array *)0x0) && (local_48->length != 0)) {
          if (local_48->length < list_00->monitors->size) {
            internal_logger(natwm_logger,LEVEL_WARNING,
                            "Encountered more monitors than items in \'monitor.offsets\' array. Ignoring offsets"
                           );
          }
          else {
            pnVar12 = list_00->monitors->head;
            if (pnVar12 != (node *)0x0) {
              lVar14 = 0;
              do {
                pvVar7 = pnVar12->data;
                monitors = (randr_monitor **)0x0;
                if (local_48->values[lVar14]->type == ARRAY) {
                  nVar9 = config_array_to_box_sizes
                                    ((local_48->values[lVar14]->data).array,(box_sizes *)&monitors);
                  if (nVar9 == NO_ERROR) {
                    *(randr_monitor ***)((long)pvVar7 + 0xc) = monitors;
                    lVar14 = lVar14 + 1;
                    bVar8 = false;
                  }
                  else {
                    internal_logger(natwm_logger,LEVEL_WARNING,
                                    "Skipping invalid monitor offset value");
                    bVar8 = true;
                  }
                }
                else {
                  internal_logger(natwm_logger,LEVEL_WARNING,"Skipping invalid monitor offset value"
                                 );
                  bVar8 = false;
                }
              } while ((!bVar8) && (pnVar12 = pnVar12->next, pnVar12 != (node *)0x0));
            }
          }
        }
        ewmh_update_desktop_viewport(state,list_00);
        *result = list_00;
        nVar9 = NO_ERROR;
      }
    }
  }
  else {
    if ((ulong)__ptr->type < 3) {
      pcVar11 = (&PTR_anon_var_dwarf_e252_00111cb0)[__ptr->type];
    }
    else {
      pcVar11 = "";
    }
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to setup %s screen(s)",pcVar11,in_R8,in_R9,
                    uVar15);
    free(__ptr);
  }
  return nVar9;
}

Assistant:

enum natwm_error monitor_setup(const struct natwm_state *state, struct monitor_list **result)
{
        struct server_extension *extension = server_extension_detect(state->xcb);

        if (extension == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        // Resolve monitors from any extension into a linked list of generic
        // monitors.
        enum natwm_error err = GENERIC_ERROR;
        struct list *monitors = NULL;

        if (extension->type == RANDR) {
                err = monitors_from_randr(state, &monitors);
        } else if (extension->type == XINERAMA) {
                err = monitors_from_xinerama(state, &monitors);
        } else {
                err = monitor_from_x(state, &monitors);
        }

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Failed to setup %s screen(s)",
                          server_extension_to_string(extension->type));

                free(extension);

                return err;
        }

        if (monitors->size == 0) {
                LOG_ERROR(natwm_logger,
                          "Failed to find a %s screen",
                          server_extension_to_string(extension->type));

                free(extension);

                return INVALID_INPUT_ERROR;
        }

        struct monitor_list *monitor_list = monitor_list_create(extension, monitors);

        if (monitor_list == NULL) {
                free(extension);
                list_destroy(monitors);

                return MEMORY_ALLOCATION_ERROR;
        }

        monitor_list_set_offsets(state, monitor_list);

        // Initialize the desktop viewport
        ewmh_update_desktop_viewport(state, monitor_list);

        *result = monitor_list;

        return NO_ERROR;
}